

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  byte bVar1;
  void *pvVar2;
  uint uVar3;
  uint64_t scopeId;
  undefined1 uVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ArrayPtr<const_char> AVar8;
  Fault f;
  ListElementCount LStack_c0;
  DebugExpression<bool> _kjCondition;
  uint3 uStack_a7;
  anon_class_16_2_3fe397bd _kjContextFunc224;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:224:5)>
  _kjContext224;
  
  this->isValid = true;
  bVar5 = (node->_reader).pointerCount == 0;
  _kjContext224.super_Context._16_8_ = (node->_reader).pointers;
  if (bVar5) {
    _kjContext224.super_Context._16_8_ = (WirePointer *)0x0;
  }
  _kjContext224.super_Context.value.ptr._0_4_ = (node->_reader).nestingLimit;
  if (bVar5) {
    _kjContext224.super_Context.value.ptr._0_4_ = 0x7fffffff;
  }
  uVar6 = 0;
  uVar7 = 0;
  _kjContext224.super_Context.super_ExceptionCallback.next._0_4_ = 0;
  _kjContext224.super_Context.super_ExceptionCallback.next._4_4_ = 0;
  if (!bVar5) {
    uVar6 = *(undefined4 *)&(node->_reader).segment;
    uVar7 = *(undefined4 *)((long)&(node->_reader).segment + 4);
    _kjContext224.super_Context.super_ExceptionCallback.next._0_4_ =
         *(undefined4 *)&(node->_reader).capTable;
    _kjContext224.super_Context.super_ExceptionCallback.next._4_4_ =
         *(undefined4 *)((long)&(node->_reader).capTable + 4);
  }
  _kjContext224.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)CONCAT44(uVar7,uVar6);
  AVar8 = (ArrayPtr<const_char>)
          capnp::_::PointerReader::getBlob<capnp::Text>
                    ((PointerReader *)&_kjContext224,(void *)0x0,0);
  (this->nodeName).super_StringPtr.content = AVar8;
  kj::_::BTreeImpl::clear(&(this->dependencies).table.indexes.impl);
  (this->dependencies).table.rows.builder.pos = (this->dependencies).table.rows.builder.ptr;
  _kjContextFunc224.this = this;
  _kjContextFunc224.node = node;
  kj::_::Debug::Context::Context(&_kjContext224.super_Context);
  _kjContext224.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__Context_00210cf8;
  if ((node->_reader).pointerCount < 6) {
    __kjCondition = 0;
  }
  else {
    __kjCondition = *(uint *)&(node->_reader).segment;
  }
  _kjContext224.func = &_kjContextFunc224;
  capnp::_::PointerReader::getList
            ((ListReader *)&f,(PointerReader *)&_kjCondition,INLINE_COMPOSITE,(word *)0x0);
  if (LStack_c0 == 0) {
    uVar3 = (node->_reader).dataSize;
    if (0x6f < uVar3) {
LAB_00177501:
      pvVar2 = (node->_reader).data;
      switch(*(undefined2 *)((long)pvVar2 + 0xc)) {
      case 1:
        f.exception = (Exception *)(node->_reader).segment;
        if (uVar3 < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)pvVar2 + 0x10);
        }
        validate(this,(Reader *)&f,scopeId);
        break;
      case 2:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
        break;
      case 3:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
        break;
      case 4:
        f.exception = (Exception *)(node->_reader).segment;
        validate(this,(Reader *)&f);
        break;
      case 5:
        if ((node->_reader).pointerCount < 4) {
          __kjCondition = 0;
        }
        else {
          __kjCondition = *(uint *)&(node->_reader).segment;
        }
        capnp::_::PointerReader::getStruct
                  ((StructReader *)&f,(PointerReader *)&_kjCondition,(word *)0x0);
        validate(this,(Reader *)&f);
      }
    }
    uVar4 = this->isValid;
  }
  else {
    uVar3 = (node->_reader).dataSize;
    if (uVar3 < 0x121) {
      __kjCondition = (uint)uStack_a7 << 8;
    }
    else {
      bVar1 = *(byte *)((long)(node->_reader).data + 0x24);
      __kjCondition = CONCAT31(uStack_a7,bVar1) & 0xffffff01;
      if ((bVar1 & 1) != 0) goto LAB_00177501;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[55]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0xe3,FAILED,"node.getIsGeneric()",
               "_kjCondition,\"if parameter list is non-empty, isGeneric must be true\"",
               &_kjCondition,(char (*) [55])"if parameter list is non-empty, isGeneric must be true"
              );
    this->isValid = false;
    kj::_::Debug::Fault::~Fault(&f);
    uVar4 = 0;
  }
  kj::_::Debug::Context::~Context(&_kjContext224.super_Context);
  return (bool)uVar4;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }